

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O3

void __thiscall cmUVReadOnlyProcess::UVPipeOutEnd(cmUVReadOnlyProcess *this,ssize_t error)

{
  ProcessResultT *pPVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint __len;
  ulong __val;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  if ((((error != 0) && (pPVar1 = (this->Setup_).Result, pPVar1->ExitStatus == 0)) &&
      (pPVar1->TermSignal == 0)) && ((pPVar1->ErrorMessage)._M_string_length == 0)) {
    std::__cxx11::string::_M_replace((ulong)&pPVar1->ErrorMessage,0,(char *)0x0,0x51deb7);
    __val = -error;
    if (0 < error) {
      __val = error;
    }
    __len = 1;
    if (9 < __val) {
      uVar4 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_001d5288;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_001d5288;
        }
        if (uVar4 < 10000) goto LAB_001d5288;
        bVar2 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        uVar3 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_001d5288:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(error >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_50[0] - (error >> 0x3f)),__len,__val);
    std::__cxx11::string::_M_append
              ((char *)&((this->Setup_).Result)->ErrorMessage,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  UVTryFinish(this);
  return;
}

Assistant:

void cmUVReadOnlyProcess::UVPipeOutEnd(ssize_t error)
{
  // Process pipe error
  if ((error != 0) && !Result()->error()) {
    Result()->ErrorMessage =
      "Reading from stdout pipe failed with libuv error code ";
    Result()->ErrorMessage += std::to_string(error);
  }
  // Try finish
  UVTryFinish();
}